

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d6630d::GetSseSum16x16DualTest_RefMseSum_Test::TestBody
          (GetSseSum16x16DualTest_RefMseSum_Test *this)

{
  int source_stride;
  undefined8 *puVar1;
  GetSseSum16x16DualTest_RefMseSum_Test *pGVar2;
  ACMRandom *this_00;
  uint8_t uVar3;
  int iVar4;
  int idx;
  long lVar5;
  uint32_t *var16x16;
  long lVar6;
  long lVar7;
  uint *puVar8;
  SEARCH_METHODS *pSVar9;
  uint *sse16x16;
  long lVar10;
  uint *puVar11;
  uint16_t in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4c0;
  AssertHelper local_4b8;
  RegisterStateCheckMMX reg_check_mmx;
  int sum_tot_simd;
  int sum_tot_c;
  uint sse_tot_simd;
  uint sse_tot_c;
  GetSseSum16x16DualTest_RefMseSum_Test *local_480;
  ACMRandom *local_478;
  ulong local_470;
  long local_468;
  long local_460;
  long local_458;
  uint *local_450;
  long local_448;
  long local_440;
  uint var2 [64];
  uint var1 [64];
  uint sse2 [64];
  uint sse1 [64];
  
  local_478 = &(this->super_GetSseSum16x16DualTest).rnd_;
  local_480 = this;
  for (local_470 = 0; this_00 = local_478, pGVar2 = local_480, (int)local_470 != 10;
      local_470 = (ulong)((int)local_470 + 1)) {
    for (lVar5 = 0; lVar5 < (pGVar2->super_GetSseSum16x16DualTest).params_.block_size;
        lVar5 = lVar5 + 1) {
      uVar3 = libaom_test::ACMRandom::Rand8(this_00);
      (pGVar2->super_GetSseSum16x16DualTest).src_[lVar5] = uVar3;
      uVar3 = libaom_test::ACMRandom::Rand8(this_00);
      (pGVar2->super_GetSseSum16x16DualTest).ref_[lVar5] = uVar3;
    }
    memset(sse1,0,0x100);
    memset(sse2,0,0x100);
    memset(var1,0,0x100);
    memset(var2,0,0x100);
    sse_tot_c = 0;
    sse_tot_simd = 0;
    sum_tot_c = 0;
    sum_tot_simd = 0;
    source_stride = (pGVar2->super_GetSseSum16x16DualTest).params_.width;
    local_468 = (long)source_stride << 4;
    lVar5 = 0;
    lVar6 = 0;
    lVar10 = 0;
    iVar4 = source_stride;
    while( true ) {
      if ((pGVar2->super_GetSseSum16x16DualTest).params_.height <= lVar5) break;
      lVar6 = (long)(int)lVar6;
      var16x16 = var2 + lVar6;
      sse16x16 = sse2 + lVar6;
      puVar11 = var1 + lVar6;
      puVar8 = sse1 + lVar6;
      lVar7 = 0;
      local_460 = lVar5;
      local_458 = lVar10;
      while (lVar7 < iVar4) {
        reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
        reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
        reg_check_mmx.pre_fpu_env_[0] = in_FPUControlWord;
        reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
        local_450 = puVar8;
        local_448 = lVar7;
        local_440 = lVar6;
        (*(pGVar2->super_GetSseSum16x16DualTest).params_.func)
                  ((pGVar2->super_GetSseSum16x16DualTest).src_ + lVar10,source_stride,
                   (pGVar2->super_GetSseSum16x16DualTest).ref_ + lVar10,source_stride,puVar8,
                   &sse_tot_simd,&sum_tot_simd,puVar11);
        libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
        aom_get_var_sse_sum_16x16_dual_c
                  ((pGVar2->super_GetSseSum16x16DualTest).src_ + lVar10,source_stride,
                   (pGVar2->super_GetSseSum16x16DualTest).ref_ + lVar10,source_stride,sse16x16,
                   &sse_tot_c,&sum_tot_c,var16x16);
        lVar6 = local_440 + 2;
        iVar4 = (pGVar2->super_GetSseSum16x16DualTest).params_.width;
        lVar10 = lVar10 + 0x20;
        var16x16 = var16x16 + 2;
        sse16x16 = sse16x16 + 2;
        puVar11 = puVar11 + 2;
        puVar8 = local_450 + 2;
        lVar7 = local_448 + 0x20;
      }
      lVar5 = local_460 + 0x10;
      lVar10 = local_458 + local_468;
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&reg_check_mmx,"sse_tot_c","sse_tot_simd",&sse_tot_c,&sse_tot_simd);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4c0);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar9 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar9 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x3ef,(char *)pSVar9);
      testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      if (local_4c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&reg_check_mmx,"sum_tot_c","sum_tot_simd",&sum_tot_c,&sum_tot_simd);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4c0);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar9 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar9 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x3f0,(char *)pSVar9);
      testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      if (local_4c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 4) {
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse1[p]","sse2[p]",(uint *)((long)sse1 + lVar5),
                 (uint *)((long)sse2 + lVar5));
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4c0);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar9 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f2,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if (local_4c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(reg_check_mmx.pre_fpu_env_ + 4));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse_tot_simd","sse_tot_c",&sse_tot_simd,&sse_tot_c);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4c0);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar9 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f3,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if (local_4c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(reg_check_mmx.pre_fpu_env_ + 4));
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&reg_check_mmx,"sum_tot_simd","sum_tot_c",&sum_tot_simd,&sum_tot_c);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4c0);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar9 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f4,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if (local_4c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(reg_check_mmx.pre_fpu_env_ + 4));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"var1[p]","var2[p]",(uint *)((long)var1 + lVar5),
                 (uint *)((long)var2 + lVar5));
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4c0);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar9 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar9 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f5,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4c0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if (local_4c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4c0._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(reg_check_mmx.pre_fpu_env_ + 4));
    }
  }
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, RefMseSum) { RefTestSseSumDual(); }